

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_store_statement
          (CompilerGLSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  SPIRType *pSVar2;
  string lhs;
  string rhs;
  string local_60;
  string local_40;
  
  to_pointer_expression_abi_cxx11_(&local_40,this,rhs_expression,true);
  if (local_40._M_string_length != 0) {
    handle_store_to_invariant_variable(this,lhs_expression,rhs_expression);
    bVar1 = unroll_array_to_complex_store(this,lhs_expression,rhs_expression);
    if (!bVar1) {
      to_dereferenced_expression_abi_cxx11_(&local_60,this,lhs_expression,true);
      bVar1 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)lhs_expression,DecorationNonUniform);
      if (bVar1) {
        convert_non_uniform_expression(this,&local_60,lhs_expression);
      }
      pSVar2 = Compiler::expression_type(&this->super_Compiler,rhs_expression);
      (*(this->super_Compiler)._vptr_Compiler[0x3f])(this,lhs_expression,&local_40,pSVar2);
      pSVar2 = Compiler::expression_type(&this->super_Compiler,rhs_expression);
      bVar1 = optimize_read_modify_write(this,pSVar2,&local_60,&local_40);
      if (!bVar1) {
        statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (this,&local_60,(char (*) [4])0x40a085,&local_40,(char (*) [2])0x414fcb);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    Compiler::register_write(&this->super_Compiler,lhs_expression);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto rhs = to_pointer_expression(rhs_expression);

	// Statements to OpStore may be empty if it is a struct with zero members. Just forward the store to /dev/null.
	if (!rhs.empty())
	{
		handle_store_to_invariant_variable(lhs_expression, rhs_expression);

		if (!unroll_array_to_complex_store(lhs_expression, rhs_expression))
		{
			auto lhs = to_dereferenced_expression(lhs_expression);
			if (has_decoration(lhs_expression, DecorationNonUniform))
				convert_non_uniform_expression(lhs, lhs_expression);

			// We might need to cast in order to store to a builtin.
			cast_to_variable_store(lhs_expression, rhs, expression_type(rhs_expression));

			// Tries to optimize assignments like "<lhs> = <lhs> op expr".
			// While this is purely cosmetic, this is important for legacy ESSL where loop
			// variable increments must be in either i++ or i += const-expr.
			// Without this, we end up with i = i + 1, which is correct GLSL, but not correct GLES 2.0.
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		register_write(lhs_expression);
	}
}